

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  vec_t vVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined8 vy;
  bool bVar4;
  short sVar5;
  short sVar6;
  int i;
  ostream *poVar7;
  HgtFilesGrid *this;
  undefined6 extraout_var;
  char *pcVar8;
  undefined8 *puVar9;
  FILE *__s;
  void *__ptr;
  size_t sVar10;
  man_page *man;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tgts;
  int iVar12;
  int jSquare;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar17;
  initializer_list<float> __l;
  int quadSize;
  uint local_1d04;
  uint local_1d00;
  int zoom;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1cf8;
  undefined8 local_1ce8;
  uint local_1cdc;
  float bottomrightlat;
  float bottomrightlon;
  float topleftlat;
  float topleftlon;
  allocator<char> local_1cc6;
  allocator<char> local_1cc5;
  allocator<char> local_1cc4;
  allocator<char> local_1cc3;
  allocator<char> local_1cc2;
  allocator<char> local_1cc1;
  allocator<char> local_1cc0;
  allocator<char> local_1cbf;
  allocator<char> local_1cbe;
  allocator<char> local_1cbd;
  allocator<char> local_1cbc;
  allocator<char> local_1cbb;
  allocator<char> local_1cba;
  allocator<char> local_1cb9 [13];
  int local_1cac;
  undefined1 local_1ca8 [16];
  void *local_1c90;
  vec_t local_1c88;
  ulong local_1c80;
  ulong local_1c78;
  HgtFilesGrid *local_1c70;
  long local_1c68;
  int local_1c5c;
  int local_1c58;
  uint local_1c54;
  uint local_1c50;
  uint local_1c4c;
  undefined1 local_1c48 [16];
  undefined1 local_1c38 [16];
  ulong local_1c20;
  double local_1c18;
  double local_1c10;
  double local_1c08;
  double local_1c00;
  string inputdir;
  string outputdir;
  string local_1bb8;
  string local_1b98;
  doc_string local_1b78;
  string local_1b58 [32];
  string local_1b38 [32];
  string local_1b18 [32];
  string local_1af8 [32];
  string local_1ad8 [32];
  string local_1ab8 [32];
  string local_1a98 [32];
  string local_1a78 [32];
  string local_1a58 [32];
  string local_1a38 [32];
  string local_1a18 [32];
  string local_19f8 [32];
  string local_19d8 [32];
  string local_19b8 [32];
  vector<float,_std::allocator<float>_> bottomrightlonlat;
  group cli;
  vec3_t line [2];
  group local_1838;
  group local_17f0;
  group local_17a8;
  group local_1760;
  group local_1718;
  group local_16d0;
  group local_1688;
  group local_1640;
  group local_15f8;
  group local_15b0;
  group local_1568;
  group local_1520;
  string fileName;
  string zoomDir;
  vec3_t tr [3];
  char ccn [10];
  parameter local_f30;
  parameter local_e30;
  parameter local_d30;
  parameter local_c30;
  parameter local_b30;
  parameter local_a30;
  parameter local_930;
  parameter local_830;
  parameter local_730;
  parameter local_630;
  parameter local_530;
  parameter local_430;
  parameter local_330;
  parameter local_230;
  parameter local_130;
  
  outputdir._M_dataplus._M_p = (pointer)&outputdir.field_2;
  outputdir._M_string_length = 0;
  outputdir.field_2._M_local_buf[0] = '\0';
  inputdir._M_dataplus._M_p = (pointer)&inputdir.field_2;
  inputdir._M_string_length = 0;
  inputdir.field_2._M_local_buf[0] = '\0';
  zoom = 0xb;
  quadSize = 0x21;
  topleftlon = -180.0;
  topleftlat = 85.0;
  bottomrightlat = 0.0;
  bottomrightlon = 180.0;
  tr[0][0] = 5.57049798397317e-315;
  tgts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line;
  __l._M_len = 2;
  __l._M_array = (iterator)tr;
  std::vector<float,_std::allocator<float>_>::vector(&bottomrightlonlat,__l,(allocator_type *)tgts);
  clipp::required<char_const(&)[3],char_const(&)[12]>
            ((parameter *)tr,(clipp *)"-o",(char (*) [3])"--outputdir",(char (*) [12])tgts);
  std::__cxx11::string::string<std::allocator<char>>(local_19b8,"output directory root",local_1cb9);
  std::__cxx11::string::operator=((string *)tr,local_19b8);
  clipp::parameter::parameter(&local_130,(parameter *)tr);
  std::__cxx11::string::string<std::allocator<char>>(local_19d8,"outputdir",&local_1cba);
  clipp::value<std::__cxx11::string&>(&local_230,(clipp *)local_19d8,&outputdir,tgts);
  clipp::operator&(&local_1640,&local_130,&local_230);
  clipp::required<char_const(&)[3],char_const(&)[11]>
            ((parameter *)line,(clipp *)"-i",(char (*) [3])"--inputdir",(char (*) [11])tgts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_19f8,
             "input directory containing hgt files from \t\t\thttp://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm"
             ,&local_1cbb);
  std::__cxx11::string::operator=((string *)line,local_19f8);
  clipp::parameter::parameter(&local_330,(parameter *)line);
  std::__cxx11::string::string<std::allocator<char>>(local_1a18,"inputdir",&local_1cbc);
  clipp::value<std::__cxx11::string&>(&local_430,(clipp *)local_1a18,&inputdir,tgts);
  clipp::operator&(&local_1688,&local_330,&local_430);
  clipp::operator_(&local_15f8,&local_1640,&local_1688);
  clipp::option<char_const(&)[3],char_const(&)[12]>
            ((parameter *)&zoomDir,(clipp *)"-z",(char (*) [3])"--zoomlevel",(char (*) [12])tgts);
  std::__cxx11::string::string<std::allocator<char>>(local_1a38,"target zoom level",&local_1cbd);
  std::__cxx11::string::operator=((string *)&zoomDir,local_1a38);
  clipp::parameter::parameter(&local_530,(parameter *)&zoomDir);
  std::__cxx11::string::string<std::allocator<char>>(local_1a58,"zoom",&local_1cbe);
  clipp::value<int&>(&local_630,(clipp *)local_1a58,(doc_string *)&zoom,(int *)tgts);
  clipp::operator&(&local_16d0,&local_530,&local_630);
  clipp::operator_(&local_15b0,&local_15f8,&local_16d0);
  clipp::option<char_const(&)[3],char_const(&)[8]>
            ((parameter *)&fileName,(clipp *)"-s",(char (*) [3])"--start",(char (*) [8])tgts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a78,"Start lon lat coordonates",&local_1cbf);
  std::__cxx11::string::operator=((string *)&fileName,local_1a78);
  clipp::parameter::parameter(&local_730,(parameter *)&fileName);
  std::__cxx11::string::string<std::allocator<char>>(local_1a98,"lon",&local_1cc0);
  clipp::value<float&>(&local_830,(clipp *)local_1a98,(doc_string *)&topleftlon,(float *)tgts);
  clipp::operator&(&local_1760,&local_730,&local_830);
  std::__cxx11::string::string<std::allocator<char>>(local_1ab8,"lat",&local_1cc1);
  clipp::value<float&>(&local_930,(clipp *)local_1ab8,(doc_string *)&topleftlat,(float *)tgts);
  clipp::operator&(&local_1718,&local_1760,&local_930);
  clipp::operator_(&local_1568,&local_15b0,&local_1718);
  clipp::option<char_const(&)[3],char_const(&)[6]>
            ((parameter *)ccn,(clipp *)"-e",(char (*) [3])"--end",(char (*) [6])tgts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ad8,"End lon lat coordonates",&local_1cc2);
  std::__cxx11::string::operator=((string *)ccn,local_1ad8);
  clipp::parameter::parameter(&local_a30,(parameter *)ccn);
  std::__cxx11::string::string<std::allocator<char>>(local_1af8,"lon",&local_1cc3);
  clipp::value<float&>(&local_b30,(clipp *)local_1af8,(doc_string *)&bottomrightlon,(float *)tgts);
  clipp::operator&(&local_17f0,&local_a30,&local_b30);
  std::__cxx11::string::string<std::allocator<char>>(local_1b18,"lat",&local_1cc4);
  clipp::value<float&>(&local_c30,(clipp *)local_1b18,(doc_string *)&bottomrightlat,(float *)tgts);
  clipp::operator&(&local_17a8,&local_17f0,&local_c30);
  clipp::operator_(&local_1520,&local_1568,&local_17a8);
  clipp::option<char_const(&)[3],char_const(&)[11]>
            (&local_e30,(clipp *)"-x",(char (*) [3])"--quadsize",(char (*) [11])tgts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b38,"Quadsize resolution default 33",&local_1cc5);
  std::__cxx11::string::operator=((string *)&local_e30,local_1b38);
  clipp::parameter::parameter(&local_d30,&local_e30);
  std::__cxx11::string::string<std::allocator<char>>(local_1b58,"size",&local_1cc6);
  clipp::value<int&>(&local_f30,(clipp *)local_1b58,(doc_string *)&quadSize,(int *)tgts);
  clipp::operator&(&local_1838,&local_d30,&local_f30);
  clipp::operator_(&cli,&local_1520,&local_1838);
  clipp::group::~group(&local_1838);
  clipp::parameter::~parameter(&local_f30);
  std::__cxx11::string::~string(local_1b58);
  clipp::parameter::~parameter(&local_d30);
  std::__cxx11::string::~string(local_1b38);
  clipp::parameter::~parameter(&local_e30);
  clipp::group::~group(&local_1520);
  clipp::group::~group(&local_17a8);
  clipp::parameter::~parameter(&local_c30);
  std::__cxx11::string::~string(local_1b18);
  clipp::group::~group(&local_17f0);
  clipp::parameter::~parameter(&local_b30);
  std::__cxx11::string::~string(local_1af8);
  clipp::parameter::~parameter(&local_a30);
  std::__cxx11::string::~string(local_1ad8);
  clipp::parameter::~parameter((parameter *)ccn);
  clipp::group::~group(&local_1568);
  clipp::group::~group(&local_1718);
  clipp::parameter::~parameter(&local_930);
  std::__cxx11::string::~string(local_1ab8);
  clipp::group::~group(&local_1760);
  clipp::parameter::~parameter(&local_830);
  std::__cxx11::string::~string(local_1a98);
  clipp::parameter::~parameter(&local_730);
  std::__cxx11::string::~string(local_1a78);
  clipp::parameter::~parameter((parameter *)&fileName);
  clipp::group::~group(&local_15b0);
  clipp::group::~group(&local_16d0);
  clipp::parameter::~parameter(&local_630);
  std::__cxx11::string::~string(local_1a58);
  clipp::parameter::~parameter(&local_530);
  std::__cxx11::string::~string(local_1a38);
  clipp::parameter::~parameter((parameter *)&zoomDir);
  clipp::group::~group(&local_15f8);
  clipp::group::~group(&local_1688);
  clipp::parameter::~parameter(&local_430);
  std::__cxx11::string::~string(local_1a18);
  clipp::parameter::~parameter(&local_330);
  std::__cxx11::string::~string(local_19f8);
  clipp::parameter::~parameter((parameter *)line);
  clipp::group::~group(&local_1640);
  clipp::parameter::~parameter(&local_230);
  std::__cxx11::string::~string(local_19d8);
  clipp::parameter::~parameter(&local_130);
  std::__cxx11::string::~string(local_19b8);
  clipp::parameter::~parameter((parameter *)tr);
  clipp::parse((parsing_result *)tr,argc,argv,&cli,1);
  bVar4 = clipp::parsing_result::operator_cast_to_bool((parsing_result *)tr);
  clipp::parsing_result::~parsing_result((parsing_result *)tr);
  if (bVar4) {
    poVar7 = std::operator<<((ostream *)&std::cout,"zoom: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,zoom);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"topleftlonlat: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,topleftlon);
    poVar7 = std::operator<<(poVar7,"|");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,topleftlat);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"bottomrightlonlat: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,bottomrightlon);
    poVar7 = std::operator<<(poVar7,"|");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,bottomrightlat);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"quadsize: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,quadSize);
    std::operator<<(poVar7,"\n");
    local_1ca8._8_4_ = extraout_XMM0_Dc;
    local_1ca8._0_8_ = (double)topleftlon;
    local_1ca8._12_4_ = extraout_XMM0_Dd;
    local_1c38._8_4_ = extraout_XMM0_Dc;
    local_1c38._0_8_ = (double)bottomrightlon;
    local_1c38._12_4_ = extraout_XMM0_Dd;
    dVar17 = Lat2Merc((double)topleftlat);
    local_1cf8._8_4_ = extraout_XMM0_Dc_00;
    local_1cf8._M_allocated_capacity = (size_type)dVar17;
    local_1cf8._12_4_ = extraout_XMM0_Dd_00;
    dVar17 = Lat2Merc((double)bottomrightlat);
    local_1c48._8_4_ = extraout_XMM0_Dc_01;
    local_1c48._0_8_ = dVar17;
    local_1c48._12_4_ = extraout_XMM0_Dd_01;
    local_1ce8 = ldexp(1.0,zoom);
    iVar12 = quadSize;
    poVar7 = std::operator<<((ostream *)&std::cout,"qm_start_in_grid: ");
    local_1c80 = (ulong)(uint)(int)(double)local_1ce8;
    local_1c18 = 40075016.68 / (double)((iVar12 + -1) * (int)(double)local_1ce8);
    iVar16 = (int)(double)local_1cf8._M_allocated_capacity;
    dVar17 = (double)(iVar12 + -1) * local_1c18;
    local_1cf8._M_allocated_capacity = (size_type)dVar17;
    local_1c58 = (int)((20037508.34 - (double)iVar16) / dVar17);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1c58);
    poVar7 = std::operator<<(poVar7,"<->");
    local_1c5c = (int)((20037508.34 - (double)(int)(double)local_1c48._0_8_) /
                      (double)local_1cf8._M_allocated_capacity);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1c5c);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)&std::cout,"qn_start_in_grid: ");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(int)(((double)(int)(((double)local_1ca8._0_8_ * 20037508.34) / 180.0
                                                   ) + -20037508.34) /
                                    (double)local_1cf8._M_allocated_capacity));
    poVar7 = std::operator<<(poVar7,"<->");
    poVar7 = (ostream *)
             std::ostream::operator<<
                       (poVar7,(int)(((double)(int)(((double)local_1c38._0_8_ * 20037508.34) / 180.0
                                                   ) + -20037508.34) /
                                    (double)local_1cf8._M_allocated_capacity));
    std::operator<<(poVar7,"\n");
    this = (HgtFilesGrid *)operator_new(0x17edc8);
    HgtFilesGrid::HgtFilesGrid(this);
    HgtFilesGrid::Init(this,4,inputdir._M_dataplus._M_p);
    local_1c78 = (ulong)(uint)(quadSize * quadSize);
    local_1c90 = operator_new__(local_1c78 * 8);
    vecSet(line[0],0.0,1000000.0,0.0);
    vecSet(line[1],0.0,-1000000.0,0.0);
    uVar11 = (uint)local_1c80;
    local_1c50 = uVar11 - 1;
    local_1c20 = local_1c78 * 4;
    local_1c54 = 0;
    if (0 < (int)uVar11) {
      local_1c54 = uVar11;
    }
    local_1cb9[9] = (allocator<char>)0x0;
    local_1cb9[10] = (allocator<char>)0x0;
    local_1cb9[0xb] = (allocator<char>)0x0;
    local_1cb9[0xc] = (allocator<char>)0x0;
    uVar11 = 0;
    local_1c70 = this;
    while (uVar11 != local_1c54) {
      local_1cdc = uVar11;
      if ((local_1c58 <= (int)uVar11) && ((int)uVar11 <= local_1c5c)) {
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar11);
        poVar7 = std::operator<<(poVar7,"/");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_1c80);
        std::operator<<(poVar7,"\n");
        for (local_1d04 = 0; local_1d04 != (uint)local_1c80; local_1d04 = local_1d04 + 1) {
          bVar4 = true;
          uVar11 = 0;
          iVar12 = quadSize;
          while ((int)uVar11 < iVar12) {
            local_1c4c = uVar11 | local_1d04;
            lVar15 = 0;
            local_1d00 = uVar11;
            while (uVar3 = local_1d00, uVar11 = local_1d04, uVar13 = (uint)lVar15,
                  (int)uVar13 < iVar12) {
              local_1cf8._M_allocated_capacity =
                   (size_type)
                   ((double)(int)(local_1d04 * (iVar12 + -1) + uVar13) * local_1c18 + -20037508.34);
              local_1ce8 = Merc2Lat(20037508.34 -
                                    (double)(int)((iVar12 + -1) * local_1cdc + local_1d00) *
                                    local_1c18);
              local_1cf8._M_allocated_capacity =
                   (size_type)(((double)local_1cf8._M_allocated_capacity * 180.0) / 20037508.34);
              if ((local_1c4c == 0 && uVar13 == 0) ||
                 ((uVar11 == local_1c50 && (quadSize - 1U == uVar13 && uVar3 == quadSize - 1U)))) {
                std::operator<<((ostream *)&std::cout,"    lon: ");
                poVar7 = std::ostream::_M_insert<double>((double)local_1cf8._M_allocated_capacity);
                std::operator<<(poVar7," lat: ");
                poVar7 = std::ostream::_M_insert<double>((double)local_1ce8);
                std::operator<<(poVar7,"\n");
              }
              local_1c68 = lVar15;
              dVar17 = ceil(90.0 - (double)local_1ce8);
              iVar12 = (int)dVar17;
              dVar17 = floor((double)local_1cf8._M_allocated_capacity + 180.0);
              jSquare = (int)dVar17;
              dVar17 = floor((double)local_1ce8);
              local_1ca8._0_8_ = (double)local_1ce8 - dVar17;
              dVar17 = floor((double)local_1cf8._M_allocated_capacity);
              local_1c48._0_8_ = (double)local_1cf8._M_allocated_capacity - dVar17;
              dVar17 = floor((double)local_1ca8._0_8_ / 0.0008333333333333334);
              iVar14 = (int)dVar17;
              dVar17 = floor((double)local_1c48._0_8_ / 0.0008333333333333334);
              iVar16 = (int)dVar17;
              sVar5 = HgtFilesGrid::GetHeight(this,iVar12,jSquare,0x4af - iVar14,iVar16);
              local_1c48._0_4_ = (int)CONCAT62(extraout_var,sVar5);
              local_1cac = iVar16 + 1;
              sVar5 = HgtFilesGrid::GetHeight(this,iVar12,jSquare,0x4af - iVar14,local_1cac);
              sVar6 = HgtFilesGrid::GetHeight(this,iVar12,jSquare,0x4b0 - iVar14,iVar16);
              local_1c38._0_2_ = sVar6;
              local_1ca8._0_8_ = (undefined8)(int)(short)local_1c48._0_2_;
              local_1c00 = (double)(0x5a - iVar12);
              local_1cb9._1_8_ = (undefined8)(jSquare + -0xb4);
              local_1c08 = (double)iVar16 * 0.0008333333333333334 + (double)local_1cb9._1_8_;
              local_1c88 = (double)(iVar14 + 1) * 0.0008333333333333334 + local_1c00;
              vecSet(tr[0],local_1c08,(vec_t)local_1ca8._0_8_,local_1c88);
              vVar1 = local_1c88;
              dVar17 = (double)local_1ca8._0_8_;
              if (iVar16 < 0x4b0) {
                dVar17 = (double)(int)sVar5;
              }
              local_1c88 = (double)local_1cac * 0.0008333333333333334 + (double)local_1cb9._1_8_;
              local_1cb9._1_8_ = dVar17;
              vecSet(tr[2],local_1c88,dVar17,vVar1);
              local_1c10 = (double)(int)(short)local_1c38._0_2_;
              if (-1 < iVar14) {
                local_1ca8._0_8_ = local_1c10;
              }
              vy = local_1ca8._0_8_;
              local_1ca8._0_8_ = (double)iVar14 * 0.0008333333333333334 + local_1c00;
              vecSet(tr[1],local_1c08,(vec_t)vy,(vec_t)local_1ca8._0_8_);
              line[1][0] = (vec_t)local_1cf8._M_allocated_capacity;
              line[0][0] = (vec_t)local_1cf8._M_allocated_capacity;
              line[1][2] = (vec_t)local_1ce8;
              line[0][2] = (vec_t)local_1ce8;
              dVar17 = (double)local_1cf8._M_allocated_capacity - tr[2][0];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_1cf8._8_8_;
              local_1cf8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            )(auVar2 << 0x40);
              if ((tr[1][2] - tr[2][2]) * dVar17 -
                  (tr[1][0] - tr[2][0]) * ((double)local_1ce8 - tr[2][2]) < 0.0) {
                sVar6 = HgtFilesGrid::GetHeight(local_1c70,iVar12,jSquare,0x4b0 - iVar14,local_1cac)
                ;
                local_1cf8._M_allocated_capacity = (size_type)(double)(int)sVar6;
                dVar17 = (double)(int)sVar6;
                if (0x4af < iVar16) {
                  dVar17 = local_1c10;
                }
                if (-1 < iVar14) {
                  local_1cb9._1_8_ = dVar17;
                }
                vecSet(tr[0],local_1c88,(vec_t)local_1cb9._1_8_,(vec_t)local_1ca8._0_8_);
              }
              *(undefined8 *)((long)local_1c90 + ((int)(local_1d00 * quadSize) + local_1c68) * 8) =
                   0;
              if ((sVar5 == 0 && local_1c48._0_2_ == 0) && local_1c38._0_2_ == 0) {
                if (((double)local_1cf8._M_allocated_capacity != 0.0) ||
                   (NAN((double)local_1cf8._M_allocated_capacity))) goto LAB_00104810;
              }
              else {
LAB_00104810:
                vVar1 = LineIntersectPlane(tr,line);
                *(vec_t *)((long)local_1c90 + ((int)(local_1d00 * quadSize) + local_1c68) * 8) =
                     vVar1;
                bVar4 = (bool)(bVar4 & vVar1 <= 0.0);
              }
              this = local_1c70;
              iVar12 = quadSize;
              lVar15 = local_1c68 + 1;
            }
            uVar11 = local_1d00 + 1;
          }
          if (!bVar4) {
            std::__cxx11::string::string((string *)&zoomDir,(string *)&outputdir);
            sprintf(ccn,"%d",(ulong)(uint)zoom);
            std::__cxx11::string::append((char *)&zoomDir);
            mkdir(zoomDir._M_dataplus._M_p,0x1c0);
            sprintf(ccn,"%d",(ulong)local_1cdc);
            pcVar8 = (char *)std::__cxx11::string::append((char *)&zoomDir);
            puVar9 = (undefined8 *)std::__cxx11::string::append(pcVar8);
            mkdir((char *)*puVar9,0x1c0);
            std::__cxx11::string::string((string *)&fileName,(string *)&zoomDir);
            std::__cxx11::string::append((char *)&fileName);
            sprintf(ccn,"%d",(ulong)local_1d04);
            pcVar8 = (char *)std::__cxx11::string::append((char *)&fileName);
            std::__cxx11::string::append(pcVar8);
            poVar7 = std::operator<<((ostream *)&std::cout,"droping: ");
            poVar7 = std::operator<<(poVar7,(string *)&fileName);
            std::operator<<(poVar7,"\n");
            __s = fopen(fileName._M_dataplus._M_p,"wb");
            iVar12 = 1;
            if (__s != (FILE *)0x0) {
              __ptr = operator_new__(local_1c20);
              for (sVar10 = 0; local_1c78 != sVar10; sVar10 = sVar10 + 1) {
                *(float *)((long)__ptr + sVar10 * 4) =
                     (float)*(double *)((long)local_1c90 + sVar10 * 8);
              }
              fwrite(__ptr,4,local_1c78,__s);
              operator_delete__(__ptr);
              fclose(__s);
              iVar12 = local_1cb9._9_4_;
            }
            std::__cxx11::string::~string((string *)&fileName);
            std::__cxx11::string::~string((string *)&zoomDir);
            local_1cb9._9_4_ = iVar12;
            if (__s == (FILE *)0x0) goto LAB_00104b56;
          }
        }
      }
      uVar11 = local_1cdc + 1;
    }
    operator_delete__(local_1c90);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b78,*argv,(allocator<char> *)&zoomDir);
    memset((doc_formatting *)tr,0,0x2a8);
    clipp::doc_formatting::doc_formatting((doc_formatting *)tr);
    clipp::make_man_page((man_page *)line,&cli,&local_1b78,(doc_formatting *)tr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b98,"DESCRIPTION",(allocator<char> *)&fileName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1bb8,
               "    This tools generates ddm file for openglobus.org \n    It needs data from  \n    - http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm\n    it is based on the fallowing project: \n    - https://github.com/openglobus/tools/tree/master/HeightsAdapter"
               ,(allocator<char> *)ccn);
    man = clipp::man_page::prepend_section((man_page *)line,&local_1b98,&local_1bb8);
    clipp::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,man);
    std::__cxx11::string::~string((string *)&local_1bb8);
    std::__cxx11::string::~string((string *)&local_1b98);
    clipp::man_page::~man_page((man_page *)line);
    clipp::doc_formatting::~doc_formatting((doc_formatting *)tr);
    std::__cxx11::string::~string((string *)&local_1b78);
  }
  iVar12 = 0;
LAB_00104b56:
  clipp::group::~group(&cli);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&bottomrightlonlat.super__Vector_base<float,_std::allocator<float>_>);
  std::__cxx11::string::~string((string *)&inputdir);
  std::__cxx11::string::~string((string *)&outputdir);
  return iVar12;
}

Assistant:

int main(int argc, char* argv[]){
	std::string outputdir;
	std::string inputdir;
	int zoom = 11;
	int quadSize = 33;
	float topleftlon = -180;
	float topleftlat = 85;
	float bottomrightlon = 180;
	float bottomrightlat = 0;
	std::vector<float> bottomrightlonlat{180, 0};
	vec_t incLat_merc, incLon_merc;

	auto cli = (
		required("-o", "--outputdir").doc("output directory root") \
		& value("outputdir", outputdir),
		required("-i", "--inputdir").doc("input directory containing hgt files from \
			http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm") \
		& value("inputdir", inputdir),
		option("-z", "--zoomlevel").doc("target zoom level") \
		& value("zoom", zoom),
		option("-s", "--start").doc("Start lon lat coordonates") \
		& value("lon", topleftlon) & value("lat", topleftlat),
		option("-e", "--end").doc("End lon lat coordonates") \
		& value("lon", bottomrightlon) & value("lat", bottomrightlat),
		option("-x", "--quadsize").doc("Quadsize resolution default 33") \
		& value("size", quadSize)
		);

	if (!parse(argc, argv, cli)) {
		std::cout << make_man_page(cli, argv[0])\
			.prepend_section("DESCRIPTION", 
                "    This tools generates ddm file for openglobus.org \n"
				"    It needs data from  \n"
				"    - http://www.viewfinderpanoramas.org/Coverage%20map%20viewfinderpanoramas_org3.htm\n"
				"    it is based on the fallowing project: \n"
				"    - https://github.com/openglobus/tools/tree/master/HeightsAdapter"
			    "");
		return 0;
	}

	std::cout << "zoom: " << zoom << "\n";
	std::cout << "topleftlonlat: " << topleftlon << "|" << topleftlat << "\n";
	std::cout << "bottomrightlonlat: " << bottomrightlon << "|" << bottomrightlat << "\n";
	std::cout << "quadsize: " << quadSize << "\n";

	int qn_start = Lon2Merc(topleftlon);
	int qn_end = Lon2Merc(bottomrightlon);
	int qm_start = Lat2Merc(topleftlat);
	int qm_end = Lat2Merc(bottomrightlat);

	int quadsCount = pow(2, zoom); //(dstFieldSize - 1) / 32;
	const int dstFieldSize = quadsCount * (quadSize - 1) + 1;//524289;// = 2^19 + 1 > 1201 * 360 - (360 - 1)
	incLat_merc = incLon_merc = 2.0 * POLE / (vec_t)(dstFieldSize - 1);

	int qm_start_in_grid = (POLE - qm_start) / (incLat_merc * (quadSize - 1));
	int qm_end_in_grid = (POLE - qm_end) / (incLat_merc * (quadSize - 1));
	int qn_start_in_grid = (qn_start - POLE) / (incLon_merc * (quadSize - 1));
	int qn_end_in_grid = (qn_end - POLE) / (incLon_merc * (quadSize - 1));

	std::cout << "qm_start_in_grid: " << qm_start_in_grid << "<->" << qm_end_in_grid << "\n";
	std::cout << "qn_start_in_grid: " << qn_start_in_grid << "<->" << qn_end_in_grid << "\n";

	HgtFilesGrid* demGrid = new HgtFilesGrid();
	
	demGrid->Init(4, inputdir.c_str());
	
	HgtFormat srcHgtFormat(1201, 1201, 1.0 / 1200.0);// 3 / 3600 == 1 / ( 1201 - 1 ) deg.
	HgtFormat srcField(srcHgtFormat.nrows * 180 - (180 - 1), srcHgtFormat.ncols * 360 - (360 - 1));
	HgtFormat dstField(dstFieldSize, dstFieldSize);

	int quadSize2 = quadSize * quadSize;
	vec_t* quadHeightData = new vec_t[quadSize2];

	vec3_t tr[3];
	vec3_t line[2];
	vecSet(line[0], 0.0, 1000000.0, 0.0);
	vecSet(line[1], 0.0, -1000000.0, 0.0);
	//LogAll("Adaptation prepared to proceed...\n");

	double lon_d = 0, lat_d = 0;
	double coordi = 0, coordj = 0;

	for (int qm = 0; qm < quadsCount; qm++) {

		if (qm >= qm_start_in_grid && qm <= qm_end_in_grid) {
			std::cout << qm << "/" << quadsCount << "\n";
			for (int qn = 0; qn < quadsCount; qn++)
			{
				bool isZeroHeight = true;
				//std::cout << "    " << quadsCount << "/" << qn << "\n";
				for (int i = 0; i < quadSize; i++) {
					//std::cout << i << "/" << quadSize << "\n";
					for (int j = 0; j < quadSize; j++) {
						coordi = POLE - ((quadSize - 1) * qm + i) * incLat_merc;
						coordj = (-1) * POLE + ((quadSize - 1) * qn + j) * incLon_merc;

						lat_d = Merc2Lat(coordi);
						lon_d = Merc2Lon(coordj);
						//int test = 100000 % (i+1);
						//std::cout << "    " << test << "\n";
						if (qn == 0 && i == 0 && j == 0 ||
							qn == quadsCount - 1 && i == quadSize - 1 && j == quadSize - 1
							) {
							std::cout << "    lon: " << lon_d << " lat: " << lat_d << "\n";
						}

						int demFileIndex_i = (int)ceil(90.0 - lat_d);
						int demFileIndex_j = (int)floor(180.0 + lon_d);

						vec_t onedlat = DegTail(lat_d);
						vec_t onedlon = DegTail(lon_d);

						int indLat = (int)floor(onedlat / srcHgtFormat.cellsize);
						int i00 = 1200 - 1 - indLat;
						int j00 = (int)floor(onedlon / srcHgtFormat.cellsize);

						vec_t h00 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00, j00);
						vec_t h01 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00, j00 + 1);
						vec_t h10 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00 + 1, j00);

						vec_t cornerLat = 90 - demFileIndex_i;
						vec_t cornerLon = -180 + demFileIndex_j;

						vecSet(tr[0],
							cornerLon + j00 * srcHgtFormat.cellsize,
							h00,
							cornerLat + (indLat + 1) * srcHgtFormat.cellsize);

						vecSet(tr[2],
							cornerLon + (j00 + 1) * srcHgtFormat.cellsize,
							j00 < srcHgtFormat.ncols - 1 ? h01 : h00,
							cornerLat + (indLat + 1) * srcHgtFormat.cellsize);

						vecSet(tr[1],
							cornerLon + j00 * srcHgtFormat.cellsize,
							i00 < srcHgtFormat.nrows - 1 ? h10 : h00,
							cornerLat + indLat * srcHgtFormat.cellsize);

						line[0][X] = line[1][X] = lon_d;
						line[0][Z] = line[1][Z] = lat_d;

						vec_t h11 = 0;

						vec_t edge = ((line[0][X] - tr[2][X]) * (tr[1][Z] - tr[2][Z]) - (line[0][Z] - tr[2][Z]) * (tr[1][X] - tr[2][X]));

						if (edge < 0.0)
						{
							h11 = demGrid->GetHeight(demFileIndex_i, demFileIndex_j, i00 + 1, j00 + 1);

							vecSet(tr[0],
								cornerLon + (j00 + 1) * srcHgtFormat.cellsize,
								i00 < srcHgtFormat.nrows - 1 && j00 < srcHgtFormat.ncols - 1 ? h11 :
								i00 < srcHgtFormat.nrows - 1 ? h10 :
								j00 < srcHgtFormat.nrows - 1 ? h01 :
								h00,
								cornerLat + indLat * srcHgtFormat.cellsize);
						}

						quadHeightData[i * quadSize + j] = 0;

						if (h00 != 0 || h01 != 0 || h10 != 0 || h11 != 0) {
							vec_t h = LineIntersectPlane(tr, line);
							quadHeightData[i * quadSize + j] = h;
							if (h > 0)
								isZeroHeight = false;
						}
					}
				}


				if (!isZeroHeight) {
					//std::cout << "    isZeroHeight : " << isZeroHeight << "\n";
					//std::cout << qm << "\n";
					char ccn[10];
					FILE* fp;

					std::string zoomDir(outputdir);
					sprintf(ccn, "%d", zoom);
					zoomDir.append(ccn);

					mkdir(zoomDir.c_str(), S_IRWXU);

					sprintf(ccn, "%d", qm);
					mkdir(zoomDir.append("/").append(ccn).c_str(), S_IRWXU);

					std::string fileName(zoomDir);
					fileName.append("/");
					sprintf(ccn, "%d", qn);
					fileName.append(ccn).append(".ddm");

					std::cout << "droping: " << fileName << "\n";
					fp = fopen(fileName.c_str(), "wb");

					if (fp == NULL) {
						//LogAll(std::string("Error: ").append(fileName).append("\n").c_str());
						return 1;
					}
					else {
						//LogAll(fileName.append("\n").c_str());
					}

					float* quadHeightData_fl = new float[quadSize2];
					for (int i = 0; i < quadSize2; i++) {
						quadHeightData_fl[i] = quadHeightData[i];
					}

					fwrite(quadHeightData_fl, sizeof(float), quadSize2, fp);
					delete[] quadHeightData_fl;
					fclose(fp);
				}

			}
		}
	}

	delete[] quadHeightData;
    return 0;    
}